

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

string * __thiscall
llvm::yaml::Node::getVerbatimTag_abi_cxx11_(string *__return_storage_ptr__,Node *this)

{
  size_t sVar1;
  const_iterator cVar2;
  ulong uVar3;
  char *pcVar4;
  StringRef Raw;
  Token local_c0;
  Child local_88;
  undefined8 local_80;
  StringRef TagHandle;
  Twine local_60;
  Twine local_48;
  
  Raw.Data = (this->Tag).Data;
  Raw.Length = (this->Tag).Length;
  if ((Raw.Length == 0) || ((Raw.Length == 1 && (*Raw.Data == '!')))) {
    switch(this->TypeID) {
    case 0:
      pcVar4 = "tag:yaml.org,2002:null";
      break;
    case 1:
    case 2:
      pcVar4 = "tag:yaml.org,2002:str";
      break;
    default:
      pcVar4 = "";
      break;
    case 4:
      pcVar4 = "tag:yaml.org,2002:map";
      break;
    case 5:
      pcVar4 = "tag:yaml.org,2002:seq";
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar4,(allocator *)&local_c0);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    sVar1 = StringRef::rfind(&Raw,'!',0xffffffffffffffff);
    if (sVar1 == 0) {
      local_88.twine = (Twine *)0x1b7a74;
      local_80 = 1;
      cVar2 = std::
              _Rb_tree<llvm::StringRef,_std::pair<const_llvm::StringRef,_llvm::StringRef>,_std::_Select1st<std::pair<const_llvm::StringRef,_llvm::StringRef>_>,_std::less<llvm::StringRef>,_std::allocator<std::pair<const_llvm::StringRef,_llvm::StringRef>_>_>
              ::find(&(((this->Doc->_M_t).
                        super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                        .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->TagMap)
                      ._M_t,(key_type *)&local_88);
      StringRef::str_abi_cxx11_((string *)&local_c0,(StringRef *)&cVar2._M_node[1]._M_left);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_c0);
      std::__cxx11::string::_M_dispose();
      pcVar4 = Raw.Data + (Raw.Length != 0);
    }
    else if ((Raw.Length < 2) || (*(short *)Raw.Data != 0x2121)) {
      sVar1 = StringRef::rfind(&Raw,'!',0xffffffffffffffff);
      TagHandle.Length = sVar1 + 1;
      if (Raw.Length < sVar1 + 1) {
        TagHandle.Length = Raw.Length;
      }
      TagHandle.Data = Raw.Data;
      cVar2 = std::
              _Rb_tree<llvm::StringRef,_std::pair<const_llvm::StringRef,_llvm::StringRef>,_std::_Select1st<std::pair<const_llvm::StringRef,_llvm::StringRef>_>,_std::less<llvm::StringRef>,_std::allocator<std::pair<const_llvm::StringRef,_llvm::StringRef>_>_>
              ::find(&(((this->Doc->_M_t).
                        super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                        .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->TagMap)
                      ._M_t,&TagHandle);
      if (cVar2._M_node ==
          (_Base_ptr)
          ((long)&(((this->Doc->_M_t).
                    super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                    .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->TagMap).
                  _M_t + 8U)) {
        local_c0.Value._M_dataplus._M_p = (pointer)&local_c0.Value.field_2;
        local_c0.Value._M_string_length = 0;
        local_c0.Value.field_2._M_local_buf[0] = '\0';
        local_c0.Kind = TK_Tag;
        local_c0.Range.Data = TagHandle.Data;
        local_c0.Range.Length = TagHandle.Length;
        Twine::Twine(&local_48,"Unknown tag handle ");
        Twine::Twine(&local_60,&TagHandle);
        Twine::concat((Twine *)&local_88,&local_48,&local_60);
        setError(this,(Twine *)&local_88,&local_c0);
      }
      else {
        StringRef::str_abi_cxx11_((string *)&local_c0,(StringRef *)&cVar2._M_node[1]._M_left);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_c0);
      }
      std::__cxx11::string::_M_dispose();
      sVar1 = StringRef::rfind(&Raw,'!',0xffffffffffffffff);
      uVar3 = sVar1 + 1;
      if (Raw.Length < sVar1 + 1) {
        uVar3 = Raw.Length;
      }
      pcVar4 = Raw.Data + uVar3;
    }
    else {
      local_88.twine = (Twine *)0x1b7a73;
      local_80 = 2;
      cVar2 = std::
              _Rb_tree<llvm::StringRef,_std::pair<const_llvm::StringRef,_llvm::StringRef>,_std::_Select1st<std::pair<const_llvm::StringRef,_llvm::StringRef>_>,_std::less<llvm::StringRef>,_std::allocator<std::pair<const_llvm::StringRef,_llvm::StringRef>_>_>
              ::find(&(((this->Doc->_M_t).
                        super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                        .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->TagMap)
                      ._M_t,(key_type *)&local_88);
      StringRef::str_abi_cxx11_((string *)&local_c0,(StringRef *)&cVar2._M_node[1]._M_left);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_c0);
      std::__cxx11::string::_M_dispose();
      sVar1 = 2;
      if (Raw.Length < 2) {
        sVar1 = Raw.Length;
      }
      pcVar4 = Raw.Data + sVar1;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pcVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Node::getVerbatimTag() const {
  StringRef Raw = getRawTag();
  if (!Raw.empty() && Raw != "!") {
    std::string Ret;
    if (Raw.find_last_of('!') == 0) {
      Ret = Doc->getTagMap().find("!")->second;
      Ret += Raw.substr(1);
      return Ret;
    } else if (Raw.startswith("!!")) {
      Ret = Doc->getTagMap().find("!!")->second;
      Ret += Raw.substr(2);
      return Ret;
    } else {
      StringRef TagHandle = Raw.substr(0, Raw.find_last_of('!') + 1);
      std::map<StringRef, StringRef>::const_iterator It =
          Doc->getTagMap().find(TagHandle);
      if (It != Doc->getTagMap().end())
        Ret = It->second;
      else {
        Token T;
        T.Kind = Token::TK_Tag;
        T.Range = TagHandle;
        setError(Twine("Unknown tag handle ") + TagHandle, T);
      }
      Ret += Raw.substr(Raw.find_last_of('!') + 1);
      return Ret;
    }
  }

  switch (getType()) {
  case NK_Null:
    return "tag:yaml.org,2002:null";
  case NK_Scalar:
  case NK_BlockScalar:
    // TODO: Tag resolution.
    return "tag:yaml.org,2002:str";
  case NK_Mapping:
    return "tag:yaml.org,2002:map";
  case NK_Sequence:
    return "tag:yaml.org,2002:seq";
  }

  return "";
}